

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-tcp-open.c
# Opt level: O0

int run_test_tcp_open_bound(void)

{
  uv_os_sock_t __fd;
  int iVar1;
  uv_loop_t *puVar2;
  undefined1 local_110 [4];
  uv_os_sock_t sock;
  uv_tcp_t server;
  sockaddr_in addr;
  
  startup();
  __fd = create_tcp_socket();
  iVar1 = uv_ip4_addr("127.0.0.1",0x23a3,(sockaddr_in *)&server.queued_fds);
  if (iVar1 != 0) {
    fprintf(_stderr,"Assertion failed in %s on line %d: %s\n",
            "/workspace/llm4binary/github/license_all_cmakelists_25/revery-ui[P]esy-libuv/test/test-tcp-open.c"
            ,0x13f,"0 == uv_ip4_addr(\"127.0.0.1\", TEST_PORT, &addr)");
    abort();
  }
  puVar2 = uv_default_loop();
  iVar1 = uv_tcp_init(puVar2,(uv_tcp_t *)local_110);
  if (iVar1 != 0) {
    fprintf(_stderr,"Assertion failed in %s on line %d: %s\n",
            "/workspace/llm4binary/github/license_all_cmakelists_25/revery-ui[P]esy-libuv/test/test-tcp-open.c"
            ,0x141,"0 == uv_tcp_init(uv_default_loop(), &server)");
    abort();
  }
  iVar1 = bind(__fd,(sockaddr *)&server.queued_fds,0x10);
  if (iVar1 != 0) {
    fprintf(_stderr,"Assertion failed in %s on line %d: %s\n",
            "/workspace/llm4binary/github/license_all_cmakelists_25/revery-ui[P]esy-libuv/test/test-tcp-open.c"
            ,0x143,"0 == bind(sock, (struct sockaddr*) &addr, sizeof(addr))");
    abort();
  }
  iVar1 = uv_tcp_open((uv_tcp_t *)local_110,__fd);
  if (iVar1 != 0) {
    fprintf(_stderr,"Assertion failed in %s on line %d: %s\n",
            "/workspace/llm4binary/github/license_all_cmakelists_25/revery-ui[P]esy-libuv/test/test-tcp-open.c"
            ,0x145,"0 == uv_tcp_open(&server, sock)");
    abort();
  }
  iVar1 = uv_listen((uv_stream_t *)local_110,0x80,(uv_connection_cb)0x0);
  if (iVar1 != 0) {
    fprintf(_stderr,"Assertion failed in %s on line %d: %s\n",
            "/workspace/llm4binary/github/license_all_cmakelists_25/revery-ui[P]esy-libuv/test/test-tcp-open.c"
            ,0x147,"0 == uv_listen((uv_stream_t*) &server, 128, NULL)");
    abort();
  }
  puVar2 = uv_default_loop();
  close_loop(puVar2);
  puVar2 = uv_default_loop();
  iVar1 = uv_loop_close(puVar2);
  if (iVar1 != 0) {
    fprintf(_stderr,"Assertion failed in %s on line %d: %s\n",
            "/workspace/llm4binary/github/license_all_cmakelists_25/revery-ui[P]esy-libuv/test/test-tcp-open.c"
            ,0x149,"0 == uv_loop_close(uv_default_loop())");
    abort();
  }
  return 0;
}

Assistant:

TEST_IMPL(tcp_open_bound) {
  struct sockaddr_in addr;
  uv_tcp_t server;
  uv_os_sock_t sock;

  startup();
  sock = create_tcp_socket();

  ASSERT(0 == uv_ip4_addr("127.0.0.1", TEST_PORT, &addr));

  ASSERT(0 == uv_tcp_init(uv_default_loop(), &server));

  ASSERT(0 == bind(sock, (struct sockaddr*) &addr, sizeof(addr)));

  ASSERT(0 == uv_tcp_open(&server, sock));

  ASSERT(0 == uv_listen((uv_stream_t*) &server, 128, NULL));

  MAKE_VALGRIND_HAPPY();
  return 0;
}